

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_DEFB(Context *ctx)

{
  long lVar1;
  size_t in_RDX;
  char dst [64];
  char acStack_58 [72];
  
  get_ARB1_destarg_varname(ctx,acStack_58,in_RDX);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s = %d;",acStack_58,(ulong)(ctx->dwords[0] != 0));
  lVar1 = (long)ctx->output_stack_len;
  if (0 < lVar1) {
    ctx->output_stack_len = (int)(lVar1 - 1U);
    ctx->output = ctx->output_stack[lVar1 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar1 + -1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_ARB1_DEFB(Context *ctx)
{
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s = %d;", dst, ctx->dwords[0] ? 1 : 0);
    pop_output(ctx);
}